

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_RegVm.cpp
# Opt level: O1

void __thiscall ExecutorRegVm::InitExecution(ExecutorRegVm *this)

{
  FastVector<char,_true,_true> *this_00;
  RegVmCmd *pRVar1;
  Linker *pLVar2;
  uint *__s;
  RegVmRegister *__s_00;
  uint uVar3;
  uint local_2c;
  RegVmCmd local_28;
  
  (this->callStack).count = 0;
  this->lastFinalReturn = 0;
  CommonSetLinker(this->exLinker);
  this_00 = &this->dataStack;
  if ((this->dataStack).max <= this->minStackSize) {
    FastVector<char,_true,_true>::grow(this_00,this->minStackSize);
  }
  (this->dataStack).count = 0;
  uVar3 = this->exLinker->globalVarSize + 0xf & 0xfffffff0;
  if ((this->dataStack).max <= uVar3) {
    FastVector<char,_true,_true>::grow(this_00,uVar3);
  }
  (this->dataStack).count = uVar3;
  GC::SetUnmanagableRange((this->dataStack).data,(this->dataStack).max);
  this->execErrorMessage = (char *)0x0;
  *(undefined8 *)&this->execErrorObject = 0;
  *(undefined8 *)((long)&(this->execErrorObject).ptr + 4) = 0;
  this->callContinue = true;
  pLVar2 = this->exLinker;
  local_28.code = '\"';
  local_28.rA = '\0';
  local_28.rB = '\x05';
  local_28.rC = '\0';
  local_28.argument = 0;
  uVar3 = (pLVar2->exRegVmCode).count;
  if (uVar3 == (pLVar2->exRegVmCode).max) {
    FastVector<RegVmCmd,_false,_false>::grow_and_add(&pLVar2->exRegVmCode,uVar3,&local_28);
  }
  else {
    (pLVar2->exRegVmCode).count = uVar3 + 1;
    pRVar1 = (pLVar2->exRegVmCode).data + uVar3;
    pRVar1->code = '\"';
    pRVar1->rA = '\0';
    pRVar1->rB = '\x05';
    pRVar1->rC = '\0';
    pRVar1->argument = 0;
  }
  pLVar2 = this->exLinker;
  local_2c = 0;
  uVar3 = (pLVar2->exRegVmExecCount).count;
  if (uVar3 == (pLVar2->exRegVmExecCount).max) {
    FastVector<unsigned_int,_false,_false>::grow_and_add(&pLVar2->exRegVmExecCount,uVar3,&local_2c);
  }
  else {
    (pLVar2->exRegVmExecCount).count = uVar3 + 1;
    (pLVar2->exRegVmExecCount).data[uVar3] = 0;
  }
  if (this->tempStackArrayBase == (uint *)0x0) {
    __s = (uint *)(*(code *)NULLC::alloc)(0x10000);
    this->tempStackArrayBase = __s;
    memset(__s,0,0x10000);
    this->tempStackArrayEnd = this->tempStackArrayBase + 0x4000;
  }
  if (this->regFileArrayBase == (RegVmRegister *)0x0) {
    __s_00 = (RegVmRegister *)(*(code *)NULLC::alloc)(0x40000);
    this->regFileArrayBase = __s_00;
    memset(__s_00,0,0x40000);
    this->regFileArrayEnd = this->regFileArrayBase + 0x8000;
  }
  this->regFileLastTop = this->regFileArrayBase;
  if ((this->exLinker->fullLinkerData).count != 0) {
    nullcVmContextMainDataAddress = (uintptr_t)this_00;
  }
  return;
}

Assistant:

void ExecutorRegVm::InitExecution()
{
	callStack.clear();

	lastFinalReturn = 0;

	CommonSetLinker(exLinker);

	dataStack.reserve(minStackSize);
	dataStack.clear();
	dataStack.resize((exLinker->globalVarSize + 0xf) & ~0xf);

	GC::SetUnmanagableRange(dataStack.data, dataStack.max);

	execErrorMessage = NULL;

	execErrorObject.typeID = 0;
	execErrorObject.ptr = NULL;

	execErrorFinalReturnDepth = 0;

	callContinue = true;

	// Add return after the last instruction to end execution of code with no return at the end
	exLinker->exRegVmCode.push_back(RegVmCmd(rviReturn, 0, rvrError, 0, 0));
	exLinker->exRegVmExecCount.push_back(0);

	if(!tempStackArrayBase)
	{
		tempStackArrayBase = (unsigned*)NULLC::alloc(sizeof(unsigned) * 1024 * 16);
		memset(tempStackArrayBase, 0, sizeof(unsigned) * 1024 * 16);
		tempStackArrayEnd = tempStackArrayBase + 1024 * 16;
	}

	if(!regFileArrayBase)
	{
		regFileArrayBase = (RegVmRegister*)NULLC::alloc(sizeof(RegVmRegister) * 1024 * 32);
		memset(regFileArrayBase, 0, sizeof(RegVmRegister) * 1024 * 32);
		regFileArrayEnd = regFileArrayBase + 1024 * 32;
	}

	regFileLastTop = regFileArrayBase;

#if !defined(NULLC_NO_RAW_EXTERNAL_CALL)
	if(!dcCallVM)
	{
		dcCallVM = dcNewCallVM(4096);
		dcMode(dcCallVM, DC_CALL_C_DEFAULT);
	}
#endif

	if(!exLinker->fullLinkerData.empty())
	{
		nullcVmContextMainDataAddress = uintptr_t(&dataStack);
	}
}